

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O3

void operator_delete__(void *p)

{
  PagemapEntry *entry;
  Array<uint16_t,_false___2_:_(true___1_:_0)> *pAVar1;
  ushort uVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  void *pvVar3;
  void **ppvVar4;
  BackendSlabMetadata *meta;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  ushort uVar11;
  uint uVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *in_FS_OFFSET;
  bool bVar16;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar6 = (ulong)p >> 10 & 0xfffffffffffffff0;
  entry = (PagemapEntry *)
          ((long)&((snmalloc::
                    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                    ::concretePagemap.body)->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta + uVar6);
  uVar6 = *(ulong *)((long)&((snmalloc::
                              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar6);
  puVar7 = (undefined1 *)(uVar6 & 0xffffffffffffff80);
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)puVar7) {
    meta = (BackendSlabMetadata *)
           ((entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
    *(meta->
     super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
     ).free_queue.end._M_elems[0] = p;
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).free_queue.end._M_elems[0] = (void **)p;
    puVar7 = &(meta->
              super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
              ).free_queue.field_0x12;
    *(short *)puVar7 = *(short *)puVar7 + -1;
    if (*(short *)puVar7 == 0) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if (puVar7 != (undefined1 *)0x0) {
    lVar15 = (this->remote_dealloc_cache).capacity;
    lVar8 = lVar15 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar6 & 0x7f) << 5));
    if (lVar8 == 0 || lVar15 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar6 & 0x7f) << 5))
       ) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar8;
    uVar6 = (entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta;
    uVar5 = uVar6 & 0xfffffffffffffffe;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
    }
    uVar6 = (ulong)(((uint)(uVar6 >> 3) & 0x1fffffff) * 0x3352d >> 0x10 & 7);
    if (uVar5 != (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar6]) {
      if (uVar5 != *(ulong *)((long)this->alloc_classes + uVar6 * 8 + -0x80)) {
        uVar11 = 0;
        lVar15 = 0;
        uVar9 = uVar6;
        bVar16 = true;
        do {
          bVar13 = bVar16;
          uVar14 = lVar15 + uVar6;
          if ((this->remote_dealloc_cache).batching.open_meta._M_elems[uVar14] == 0) {
            puVar10 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar14;
            goto LAB_00104961;
          }
          uVar2 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar14].length.
                  _M_elems[0];
          bVar16 = uVar11 < uVar2;
          if (uVar11 <= uVar2) {
            uVar11 = uVar2;
          }
          if (bVar16) {
            uVar9 = uVar14;
          }
          lVar15 = 1;
          bVar16 = false;
        } while (bVar13);
        puVar10 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar9;
        uVar14 = uVar9;
        if (*puVar10 != 0) {
          uVar11 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].length.
                   _M_elems[0];
          pvVar3 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].head._M_elems
                   [0];
          ppvVar4 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].end._M_elems
                    [0];
          (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].end._M_elems[0] =
               (void **)((this->remote_dealloc_cache).batching.open_builder._M_elems + uVar9);
          (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].length._M_elems[0] = 0;
          if (ppvVar4 != (void **)0x0) {
            ppvVar4[1] = (void *)0x0;
          }
          *ppvVar4 = (void *)(((long)pvVar3 - (long)ppvVar4) * 0x800 + (ulong)uVar11);
          uVar12 = *(uint *)((long)&((snmalloc::
                                      BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                      ::concretePagemap.body)->
                                    super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                    ).super_MetaEntryBase.remote_and_sizeclass +
                            ((ulong)ppvVar4 >> 10 & 0xfffffffffffffff0)) >> 0xe & 0xff;
          *(this->remote_dealloc_cache).list._M_elems[uVar12].end._M_elems[0] = ppvVar4 + 1;
          (this->remote_dealloc_cache).list._M_elems[uVar12].end._M_elems[0] = ppvVar4 + 1;
          *puVar10 = 0;
        }
LAB_00104961:
        *puVar10 = uVar5;
        (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar14].head._M_elems[0] = p;
        (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar14].end._M_elems[0] =
             (void **)p;
        (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar14].length._M_elems[0] = 1;
        return;
      }
      uVar6 = uVar6 + 1;
    }
    *(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].end._M_elems[0] = p;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].end._M_elems[0] = (void **)p;
    pAVar1 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].length;
    pAVar1->_M_elems[0] = pAVar1->_M_elems[0] + 1;
  }
  return;
}

Assistant:

void operator delete[](void* p) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}